

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httphandler.cpp
# Opt level: O0

string * __thiscall HttpHandler::param(string *__return_storage_ptr__,HttpHandler *this,string *key)

{
  mapped_type *__str;
  string *key_local;
  HttpHandler *this_local;
  
  __str = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](this->parameter,key);
  std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpHandler::param(const std::string key)
{
    return (*this->parameter)[key];
}